

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

unique_ptr<argo::json,_std::default_delete<argo::json>_> __thiscall
argo::parser::parse_array(parser *this,lexer *l,size_t nesting_depth)

{
  _func_int **st;
  token_type tVar1;
  json_parser_exception *pjVar2;
  size_t sVar3;
  json *this_00;
  pointer pjVar4;
  json_array *pjVar5;
  string *s;
  _func_int **in_RCX;
  undefined1 local_60 [16];
  token *t2;
  token *local_40;
  token *t1;
  size_t nesting_depth_local;
  lexer *l_local;
  parser *this_local;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> *array;
  
  nesting_depth_local = nesting_depth;
  l_local = l;
  this_local = this;
  if ((l->m_token)._vptr_token < in_RCX) {
    pjVar2 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
    st = (l->m_token)._vptr_token;
    sVar3 = reader::get_byte_index((reader *)l->_vptr_lexer);
    json_parser_exception::json_parser_exception
              (pjVar2,maximum_nesting_depth_exceeded_e,(size_t)st,sVar3);
    __cxa_throw(pjVar2,&json_parser_exception::typeinfo,
                json_parser_exception::~json_parser_exception);
  }
  t1._3_1_ = 0;
  this_00 = (json *)operator_new(0x58);
  json::json(this_00,array_e);
  std::unique_ptr<argo::json,std::default_delete<argo::json>>::
  unique_ptr<std::default_delete<argo::json>,void>
            ((unique_ptr<argo::json,std::default_delete<argo::json>> *)this,this_00);
  local_40 = lexer::next((lexer *)nesting_depth_local);
  tVar1 = token::get_type(local_40);
  if (tVar1 != end_array_e) {
    lexer::put_back_last((lexer *)nesting_depth_local);
    pjVar4 = std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::operator->
                       ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)this);
    pjVar5 = json::get_array(pjVar4);
    parse_value((parser *)&t2,l,nesting_depth_local);
    std::
    vector<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
    ::push_back(pjVar5,(value_type *)&t2);
    std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr
              ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)&t2);
    while( true ) {
      local_60._8_8_ = lexer::next((lexer *)nesting_depth_local);
      tVar1 = token::get_type((token *)local_60._8_8_);
      if (tVar1 != value_separator_e) break;
      pjVar4 = std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::operator->
                         ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)this);
      pjVar5 = json::get_array(pjVar4);
      parse_value((parser *)local_60,l,nesting_depth_local);
      std::
      vector<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
      ::push_back(pjVar5,(value_type *)local_60);
      std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr
                ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)local_60);
    }
    tVar1 = token::get_type((token *)local_60._8_8_);
    if (tVar1 != end_array_e) {
      pjVar2 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
      s = token::get_raw_value_abi_cxx11_((token *)local_60._8_8_);
      sVar3 = reader::get_byte_index((reader *)l->_vptr_lexer);
      json_parser_exception::json_parser_exception(pjVar2,unexpected_token_e,s,sVar3);
      __cxa_throw(pjVar2,&json_parser_exception::typeinfo,
                  json_parser_exception::~json_parser_exception);
    }
  }
  return (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)
         (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)this;
}

Assistant:

unique_ptr<json> parser::parse_array(lexer &l, size_t nesting_depth)
{
    if (nesting_depth > m_max_nesting_depth)
    {
        throw json_parser_exception(
                            json_parser_exception::maximum_nesting_depth_exceeded_e,
                            m_max_nesting_depth,
                            m_reader.get_byte_index());
    }

    unique_ptr<json> array = unique_ptr<json>(new json(json::array_e));

    const token &t1 = l.next();

    if (t1.get_type() == token::end_array_e)
    {
        return array;
    }
    else
    {
        l.put_back_last();
        array->get_array().push_back(parse_value(l, nesting_depth));
    }

    while (true)
    {
        const token &t2 = l.next();

        if (t2.get_type() == token::value_separator_e)
        {
            array->get_array().push_back(parse_value(l, nesting_depth));
        }
        else if (t2.get_type() == token::end_array_e)
        {
            return array;
        }
        else
        {
            throw json_parser_exception(
                            json_parser_exception::unexpected_token_e,
                            t2.get_raw_value(),
                            m_reader.get_byte_index());
        }
    }
    
    return array;
}